

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_op_shl(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  ulong uVar1;
  GCObject *pGVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (rb->tt_ == 3) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (rb->value_).n;
    auVar5 = vroundsd_avx(auVar5,auVar5,9);
    dVar4 = auVar5._0_8_;
    if (((dVar4 != (rb->value_).n) || (dVar4 < -9.223372036854776e+18)) ||
       (9.223372036854776e+18 <= dVar4)) goto LAB_0014a67f;
    uVar3 = (ulong)dVar4;
  }
  else {
    if (rb->tt_ != 0x13) goto LAB_0014a67f;
    uVar3 = (rb->value_).i;
  }
  if (rc->tt_ == 3) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (rc->value_).n;
    auVar5 = vroundsd_avx(auVar6,auVar6,9);
    dVar4 = auVar5._0_8_;
    if (((dVar4 != (rc->value_).n) || (dVar4 < -9.223372036854776e+18)) ||
       (9.223372036854776e+18 <= dVar4)) goto LAB_0014a67f;
    uVar1 = (ulong)dVar4;
  }
  else {
    if (rc->tt_ != 0x13) {
LAB_0014a67f:
      luaT_trybinTM(L,rb,rc,ra,TM_SHL);
      return;
    }
    uVar1 = (rc->value_).i;
  }
  if ((long)uVar1 < 0) {
    if (uVar1 < 0xffffffffffffffc1) {
      pGVar2 = (GCObject *)0x0;
    }
    else {
      pGVar2 = (GCObject *)(uVar3 >> ((ulong)(byte)-(char)uVar1 & 0x3f));
    }
  }
  else {
    pGVar2 = (GCObject *)0x0;
    if (uVar1 < 0x40) {
      pGVar2 = (GCObject *)(uVar3 << (uVar1 & 0x3f));
    }
  }
  (ra->value_).gc = pGVar2;
  ra->tt_ = 0x13;
  return;
}

Assistant:

void raviV_op_shl(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Integer ib;
  lua_Integer ic;
  if (tointegerns(rb, &ib) && tointegerns(rc, &ic)) {
    setivalue(ra, luaV_shiftl(ib, ic));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_SHL);
  }
}